

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lockbitmap.c
# Opt level: O1

int main(int argc,char **argv)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  long *plVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  char cVar19;
  long lVar20;
  byte bVar21;
  char *pcVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  char cVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ALLEGRO_EVENT event;
  int local_78;
  int local_58;
  uint local_54;
  int local_38;
  int iVar37;
  int iVar43;
  int iVar44;
  int iVar45;
  
  cVar9 = al_install_system(0x85020700,atexit);
  if (cVar9 == '\0') goto LAB_00102c5f;
  al_install_keyboard();
  al_install_mouse();
  al_install_touch_input();
  lVar11 = al_create_display(0x300,0x100);
  if (lVar11 == 0) {
    pcVar22 = "Error creating display\n";
LAB_00102c58:
    do {
      abort_example(pcVar22);
LAB_00102c5f:
      pcVar22 = "Could not init Allegro.\n";
    } while( true );
  }
  uVar12 = al_create_event_queue();
  uVar13 = al_get_keyboard_event_source();
  al_register_event_source(uVar12,uVar13);
  uVar13 = al_get_mouse_event_source();
  al_register_event_source(uVar12,uVar13);
  cVar9 = al_is_touch_input_installed();
  if (cVar9 != '\0') {
    uVar13 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar12,uVar13);
  }
  log_printf("Press space to change bitmap type\n");
  log_printf("Press w to toggle WRITEONLY mode\n");
  bVar21 = 2;
  auVar28._8_4_ = 0xffffffff;
  auVar28._0_8_ = 0xffffffffffffffff;
  auVar28._12_4_ = 0xffffffff;
  cVar9 = '\0';
  cVar19 = '\0';
LAB_001024f1:
  bVar23 = true;
LAB_001024f4:
  do {
    pcVar22 = " in write-only mode\n";
    if (bVar21 == 0) {
      pcVar22 = " in read/write mode\n";
    }
    auVar25 = ZEXT116(bVar21 == 0);
    auVar25 = pshuflw(auVar25,auVar25,0);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    do {
      if (bVar23) {
        if (cVar19 == '\x01') {
          log_printf("Locking memory bitmap");
          al_map_rgb(0,0,0);
          al_clear_to_color();
          uVar13 = 1;
LAB_00102588:
          al_set_new_bitmap_flags(uVar13);
          lVar14 = al_create_bitmap(0x300,0x100);
        }
        else {
          if (cVar19 == '\0') {
            log_printf("Locking video bitmap");
            al_map_rgb(0,0,0);
            al_clear_to_color();
            uVar13 = 0x400;
            goto LAB_00102588;
          }
          log_printf("Locking display backbuffer");
          lVar14 = al_get_backbuffer(lVar11);
        }
        if (lVar14 == 0) {
          pcVar22 = "Error creating bitmap";
          goto LAB_00102c58;
        }
        log_printf(pcVar22);
        al_set_target_bitmap(lVar14);
        al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f666666);
        al_clear_to_color();
        al_set_target_backbuffer(lVar11);
        plVar15 = (long *)al_lock_bitmap_region(lVar14,0xc1,0x41,0x17d,0x7f,0xd,bVar21);
        if (plVar15 != (long *)0x0) {
          iVar10 = *(int *)((long)plVar15 + 0xc);
          lVar16 = *plVar15 + 0xe;
          uVar18 = 0;
          do {
            iVar17 = (int)uVar18;
            cVar27 = (char)uVar18 * '\x02';
            auVar26 = ZEXT116(uVar18 == 0x7e || uVar18 == 0);
            auVar26 = pshuflw(auVar26,auVar26,0);
            uVar24 = auVar26._0_4_;
            auVar26 = ZEXT216(CONCAT11(cVar27,cVar27));
            auVar29 = pshuflw(auVar26,auVar26,0);
            auVar26 = ZEXT116((byte)((uVar18 & 0xffffffff) >> 2) & 0x3f);
            auVar26 = pshuflw(auVar26,auVar26,0);
            auVar30._0_4_ = auVar26._0_4_;
            auVar30._4_4_ = auVar30._0_4_;
            auVar30._8_4_ = auVar30._0_4_;
            auVar30._12_4_ = auVar30._0_4_;
            auVar30 = psllw(auVar30,0xb);
            lVar20 = 0;
            auVar26 = _DAT_00103020;
            auVar62 = _DAT_00103010;
            do {
              auVar46._8_4_ = (int)lVar20;
              auVar46._0_8_ = lVar20;
              auVar46._12_4_ = (int)((ulong)lVar20 >> 0x20);
              auVar47 = (auVar46 | _DAT_00103060) ^ _DAT_00103070;
              auVar55._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar55._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar55._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar55._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar52._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar52._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar52._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar52._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar47 = (auVar46 | _DAT_00103050) ^ _DAT_00103070;
              auVar61._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar61._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar61._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar61._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar48._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar48._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar48._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar48._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar49 = packssdw(auVar48 & auVar61,auVar52 & auVar55);
              auVar47 = (auVar46 | _DAT_00103040) ^ _DAT_00103070;
              auVar56._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar56._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar56._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar56._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar38._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar38._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar38._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar38._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar47 = (auVar46 | _DAT_00103030) ^ _DAT_00103070;
              auVar58._0_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar58._4_4_ = -(uint)(auVar47._0_4_ < -0x7ffffe83);
              auVar58._8_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar58._12_4_ = -(uint)(auVar47._8_4_ < -0x7ffffe83);
              auVar31._0_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar31._4_4_ = -(uint)(auVar47._4_4_ == -0x80000000);
              auVar31._8_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar31._12_4_ = -(uint)(auVar47._12_4_ == -0x80000000);
              auVar47 = packssdw(auVar31 & auVar58,auVar38 & auVar56);
              auVar31 = packssdw(auVar47,auVar49);
              iVar32 = auVar26._0_4_;
              auVar59._0_4_ = -(uint)(iVar32 == 0);
              iVar34 = auVar26._4_4_;
              auVar59._4_4_ = -(uint)(iVar34 == 0);
              iVar35 = auVar26._8_4_;
              iVar36 = auVar26._12_4_;
              auVar59._8_4_ = -(uint)(iVar35 == 0);
              auVar59._12_4_ = -(uint)(iVar36 == 0);
              iVar37 = auVar62._0_4_;
              auVar39._0_4_ = -(uint)(iVar37 == 0);
              iVar43 = auVar62._4_4_;
              auVar39._4_4_ = -(uint)(iVar43 == 0);
              iVar44 = auVar62._8_4_;
              iVar45 = auVar62._12_4_;
              auVar39._8_4_ = -(uint)(iVar44 == 0);
              auVar39._12_4_ = -(uint)(iVar45 == 0);
              auVar49 = packssdw(auVar59,auVar39);
              auVar47._4_4_ = uVar24;
              auVar47._0_4_ = uVar24;
              auVar47._8_4_ = uVar24;
              auVar47._12_4_ = uVar24;
              auVar57._0_4_ = -(uint)(iVar32 == 0x17c);
              auVar57._4_4_ = -(uint)(iVar34 == 0x17c);
              auVar57._8_4_ = -(uint)(iVar35 == 0x17c);
              auVar57._12_4_ = -(uint)(iVar36 == 0x17c);
              auVar40._0_4_ = -(uint)(iVar37 == 0x17c);
              auVar40._4_4_ = -(uint)(iVar43 == 0x17c);
              auVar40._8_4_ = -(uint)(iVar44 == 0x17c);
              auVar40._12_4_ = -(uint)(iVar45 == 0x17c);
              auVar58 = packssdw(auVar57,auVar40);
              auVar59 = ~(auVar58 | auVar49 | auVar47) & auVar31;
              auVar26 = auVar26 ^ _DAT_00103070;
              auVar50._0_4_ = -(uint)(auVar26._0_4_ < -0x7fffff81);
              auVar50._4_4_ = -(uint)(auVar26._4_4_ < -0x7fffff81);
              auVar50._8_4_ = -(uint)(auVar26._8_4_ < -0x7fffff81);
              auVar50._12_4_ = -(uint)(auVar26._12_4_ < -0x7fffff81);
              auVar62 = auVar62 ^ _DAT_00103070;
              auVar33._0_4_ = -(uint)(auVar62._0_4_ < -0x7fffff81);
              auVar33._4_4_ = -(uint)(auVar62._4_4_ < -0x7fffff81);
              auVar33._8_4_ = -(uint)(auVar62._8_4_ < -0x7fffff81);
              auVar33._12_4_ = -(uint)(auVar62._12_4_ < -0x7fffff81);
              auVar58 = packssdw(auVar50,auVar33);
              auVar47 = ~auVar58 & auVar59;
              auVar49 = auVar47 & _DAT_001030b0;
              sVar1 = auVar49._0_2_;
              sVar2 = auVar49._2_2_;
              auVar41[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar49[2] - (0xff < sVar2);
              auVar41[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar49[0] - (0xff < sVar1);
              sVar3 = auVar49._4_2_;
              auVar41[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar49[4] - (0xff < sVar3);
              sVar4 = auVar49._6_2_;
              auVar41[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar49[6] - (0xff < sVar4);
              sVar5 = auVar49._8_2_;
              auVar41[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar49[8] - (0xff < sVar5);
              sVar6 = auVar49._10_2_;
              auVar41[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[10] - (0xff < sVar6);
              sVar7 = auVar49._12_2_;
              auVar41[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[0xc] - (0xff < sVar7);
              sVar8 = auVar49._14_2_;
              auVar41[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[0xe] - (0xff < sVar8);
              auVar41[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar49[0] - (0xff < sVar1);
              auVar41[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar49[2] - (0xff < sVar2);
              auVar41[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar49[4] - (0xff < sVar3);
              auVar41[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar49[6] - (0xff < sVar4);
              auVar41[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar49[8] - (0xff < sVar5);
              auVar41[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[10] - (0xff < sVar6);
              auVar41[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[0xc] - (0xff < sVar7);
              auVar41[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[0xe] - (0xff < sVar8);
              auVar49 = psllw(auVar41,7);
              auVar49 = auVar49 & _DAT_001030c0;
              auVar53[0] = -(auVar49[0] < '\0');
              auVar53[1] = -(auVar49[1] < '\0');
              auVar53[2] = -(auVar49[2] < '\0');
              auVar53[3] = -(auVar49[3] < '\0');
              auVar53[4] = -(auVar49[4] < '\0');
              auVar53[5] = -(auVar49[5] < '\0');
              auVar53[6] = -(auVar49[6] < '\0');
              auVar53[7] = -(auVar49[7] < '\0');
              auVar53[8] = -(auVar49[8] < '\0');
              auVar53[9] = -(auVar49[9] < '\0');
              auVar53[10] = -(auVar49[10] < '\0');
              auVar53[0xb] = -(auVar49[0xb] < '\0');
              auVar53[0xc] = -(auVar49[0xc] < '\0');
              auVar53[0xd] = -(auVar49[0xd] < '\0');
              auVar53[0xe] = -(auVar49[0xe] < '\0');
              auVar53[0xf] = -(auVar49[0xf] < '\0');
              auVar47 = psllw(auVar47,0xf);
              auVar47 = psraw(auVar47,0xf);
              auVar42._0_4_ = -(uint)(auVar26._0_4_ < -0x7fffff02);
              auVar42._4_4_ = -(uint)(auVar26._4_4_ < -0x7fffff02);
              auVar42._8_4_ = -(uint)(auVar26._8_4_ < -0x7fffff02);
              auVar42._12_4_ = -(uint)(auVar26._12_4_ < -0x7fffff02);
              auVar49._0_4_ = -(uint)(auVar62._0_4_ < -0x7fffff02);
              auVar49._4_4_ = -(uint)(auVar62._4_4_ < -0x7fffff02);
              auVar49._8_4_ = -(uint)(auVar62._8_4_ < -0x7fffff02);
              auVar49._12_4_ = -(uint)(auVar62._12_4_ < -0x7fffff02);
              auVar26 = packssdw(auVar42,auVar49);
              auVar62 = packsswb(auVar26,auVar26);
              auVar58 = auVar58 & auVar59;
              auVar26 = auVar58 & _DAT_001030b0;
              sVar1 = auVar26._0_2_;
              sVar2 = auVar26._2_2_;
              auVar60[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar26[2] - (0xff < sVar2);
              auVar60[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar26[0] - (0xff < sVar1);
              sVar3 = auVar26._4_2_;
              auVar60[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar26[4] - (0xff < sVar3);
              sVar4 = auVar26._6_2_;
              auVar60[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar26[6] - (0xff < sVar4);
              sVar5 = auVar26._8_2_;
              auVar60[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar26[8] - (0xff < sVar5);
              sVar6 = auVar26._10_2_;
              auVar60[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar26[10] - (0xff < sVar6);
              sVar7 = auVar26._12_2_;
              auVar60[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar26[0xc] - (0xff < sVar7);
              sVar8 = auVar26._14_2_;
              auVar60[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8);
              auVar60[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar26[0] - (0xff < sVar1);
              auVar60[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar26[2] - (0xff < sVar2);
              auVar60[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar26[4] - (0xff < sVar3);
              auVar60[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar26[6] - (0xff < sVar4);
              auVar60[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar26[8] - (0xff < sVar5);
              auVar60[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar26[10] - (0xff < sVar6);
              auVar60[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar26[0xc] - (0xff < sVar7);
              auVar60[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8);
              auVar26 = psllw(auVar60,7);
              auVar26 = auVar26 & _DAT_001030c0;
              auVar63[0] = -(auVar26[0] < '\0');
              auVar63[1] = -(auVar26[1] < '\0');
              auVar63[2] = -(auVar26[2] < '\0');
              auVar63[3] = -(auVar26[3] < '\0');
              auVar63[4] = -(auVar26[4] < '\0');
              auVar63[5] = -(auVar26[5] < '\0');
              auVar63[6] = -(auVar26[6] < '\0');
              auVar63[7] = -(auVar26[7] < '\0');
              auVar63[8] = -(auVar26[8] < '\0');
              auVar63[9] = -(auVar26[9] < '\0');
              auVar63[10] = -(auVar26[10] < '\0');
              auVar63[0xb] = -(auVar26[0xb] < '\0');
              auVar63[0xc] = -(auVar26[0xc] < '\0');
              auVar63[0xd] = -(auVar26[0xd] < '\0');
              auVar63[0xe] = -(auVar26[0xe] < '\0');
              auVar63[0xf] = -(auVar26[0xf] < '\0');
              auVar26 = psllw(auVar58,0xf);
              auVar26 = psraw(auVar26,0xf);
              auVar26 = ~auVar47 & auVar26 & _DAT_001030e0 | auVar30 & auVar47;
              auVar47 = ~auVar53 & auVar63 & auVar29;
              auVar49 = (auVar62 | auVar29) & auVar53 | auVar47;
              auVar47 = (auVar62 ^ _DAT_00103100 | auVar29 & auVar62) & auVar53 | auVar47;
              auVar54._0_4_ = (iVar32 + iVar17) * 0x10000 >> 0x10;
              auVar54._4_4_ = (iVar34 + iVar17) * 0x10000 >> 0x10;
              auVar54._8_4_ = (iVar35 + iVar17) * 0x10000 >> 0x10;
              auVar54._12_4_ = (iVar36 + iVar17) * 0x10000 >> 0x10;
              auVar51._0_4_ = (iVar37 + iVar17) * 0x10000 >> 0x10;
              auVar51._4_4_ = (iVar43 + iVar17) * 0x10000 >> 0x10;
              auVar51._8_4_ = (iVar44 + iVar17) * 0x10000 >> 0x10;
              auVar51._12_4_ = (iVar45 + iVar17) * 0x10000 >> 0x10;
              auVar62 = packssdw(auVar54,auVar51);
              auVar31 = auVar31 & (auVar25 ^ auVar28 | auVar62 & auVar25);
              if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -0xe + lVar20 * 2) =
                     auVar26._0_2_ | (ushort)(byte)(auVar47[0] >> 3) |
                     (ushort)(byte)(auVar49[0] >> 2) << 5;
              }
              if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
                *(ushort *)(lVar16 + -0xc + lVar20 * 2) =
                     auVar26._2_2_ |
                     (ushort)(auVar49._0_4_ >> 5) & 0x7e0 | (ushort)(auVar47._0_4_ >> 0xb) & 0x1f;
              }
              if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -10 + lVar20 * 2) =
                     auVar26._4_2_ |
                     (ushort)(auVar49._0_4_ >> 0xd) & 0x7e0 | auVar47._2_2_ >> 3 & 0x1f;
              }
              if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -8 + lVar20 * 2) =
                     auVar26._6_2_ | auVar49._2_2_ >> 5 & 0xffe0 | auVar47._2_2_ >> 0xb;
              }
              if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -6 + lVar20 * 2) =
                     auVar26._8_2_ | (ushort)((byte)(auVar47._4_2_ >> 3) & 0x1f) |
                     (ushort)((byte)(auVar49._4_2_ >> 2) & 0x3f) << 5;
              }
              if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -4 + lVar20 * 2) =
                     auVar26._10_2_ | auVar49._4_2_ >> 5 & 0xffe0 | auVar47._4_2_ >> 0xb;
              }
              if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + -2 + lVar20 * 2) =
                     auVar26._12_2_ | (ushort)((byte)(auVar47._6_2_ >> 3) & 0x1f) |
                     (ushort)((byte)(auVar49._6_2_ >> 2) & 0x3f) << 5;
              }
              if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(ushort *)(lVar16 + lVar20 * 2) =
                     auVar26._14_2_ | auVar49._6_2_ >> 5 & 0xffe0 | auVar47._6_2_ >> 0xb;
              }
              lVar20 = lVar20 + 8;
              auVar26._0_4_ = iVar32 + (int)DAT_001030f0;
              auVar26._4_4_ = iVar34 + DAT_001030f0._4_4_;
              auVar26._8_4_ = iVar35 + DAT_001030f0._8_4_;
              auVar26._12_4_ = iVar36 + DAT_001030f0._12_4_;
              auVar62._0_4_ = iVar37 + (int)DAT_001030f0;
              auVar62._4_4_ = iVar43 + DAT_001030f0._4_4_;
              auVar62._8_4_ = iVar44 + DAT_001030f0._8_4_;
              auVar62._12_4_ = iVar45 + DAT_001030f0._12_4_;
            } while (lVar20 != 0x180);
            uVar18 = uVar18 + 1;
            lVar16 = lVar16 + iVar10;
          } while (uVar18 != 0x7f);
          al_unlock_bitmap(lVar14);
        }
        if (cVar19 != '\x02') {
          al_draw_bitmap(0,0,lVar14,0);
          al_destroy_bitmap(lVar14);
        }
        al_flip_display();
        bVar23 = false;
      }
      al_wait_for_event(uVar12);
      if (local_78 == 0xb) {
        auVar28._8_4_ = 0xffffffff;
        auVar28._0_8_ = 0xffffffffffffffff;
        auVar28._12_4_ = 0xffffffff;
        if (local_58 == 0x3b) {
          return 0;
        }
        if (local_54 == 0x20) {
          cVar9 = (cVar19 == '\x01') * '\x02';
          bVar23 = cVar19 == '\0';
          cVar19 = (cVar19 == '\x01') * '\x02';
          if (bVar23) {
            cVar9 = '\x01';
            cVar19 = '\x01';
          }
          goto LAB_001024f1;
        }
        if ((local_54 & 0xffffffdf) == 0x57) {
          bVar23 = true;
          bVar21 = bVar21 ^ 2;
        }
        goto LAB_001024f4;
      }
    } while ((local_78 != 0x15) || (local_38 != 1));
    iVar10 = al_get_display_width(lVar11);
    if (local_58 < iVar10 / 2) {
      bVar23 = cVar9 == '\x01';
      cVar9 = bVar23 * '\x02';
      cVar27 = bVar23 * '\x02';
      if (cVar19 == '\0') {
        cVar9 = '\x01';
        cVar27 = '\x01';
      }
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      cVar19 = cVar27;
      goto LAB_001024f1;
    }
    bVar23 = true;
    auVar28._8_4_ = 0xffffffff;
    auVar28._0_8_ = 0xffffffffffffffff;
    auVar28._12_4_ = 0xffffffff;
    bVar21 = bVar21 ^ 2;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   enum Mode mode = MODE_VIDEO;
   int lock_flags = ALLEGRO_LOCK_WRITEONLY;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_install_touch_input();

   open_log();

   /* Create a window. */
   display = al_create_display(3*256, 256);
   if (!display) {
      abort_example("Error creating display\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_mouse_event_source());
   if (al_is_touch_input_installed()) {
      al_register_event_source(events,
         al_get_touch_input_mouse_emulation_event_source());
   }

   log_printf("Press space to change bitmap type\n");
   log_printf("Press w to toggle WRITEONLY mode\n");

   for (;;) {
      if (redraw) {
         draw(display, mode, lock_flags);
         redraw = false;
      }

      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.unichar == ' ') {
            mode = cycle_mode(mode);
            redraw = true;
         }
         else if (event.keyboard.unichar == 'w' || event.keyboard.unichar == 'W') {
            lock_flags = toggle_writeonly(lock_flags);
            redraw = true;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            if (event.mouse.x < al_get_display_width(display) / 2) {
               mode = cycle_mode(mode);
            }
            else {
               lock_flags = toggle_writeonly(lock_flags);
            }
            redraw = true;
         }
      }
   }

   close_log(false);
   return 0;
}